

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_form_insert2_unconstrain(REF_CAVITY ref_cavity,REF_INT faceid)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  int iVar5;
  undefined8 uVar6;
  REF_INT *pRVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  REF_INT cell;
  REF_INT nodes [4];
  int local_4c;
  int local_48;
  undefined4 local_44;
  undefined4 local_40;
  
  if ((ulong)ref_cavity->state != 2) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x498,
           "ref_cavity_form_insert2_unconstrain",
           "attempt to unconstrain cavity that is not boundary constrained",2,
           (ulong)ref_cavity->state);
    return 1;
  }
  ref_cell = ref_cavity->ref_grid->cell[3];
  ref_cavity->state = REF_CAVITY_UNKNOWN;
  if (0 < ref_cavity->maxface) {
    uVar3 = 1;
    lVar10 = 8;
    lVar11 = 0;
    do {
      pRVar1 = ref_cavity->f2n;
      iVar5 = *(int *)((long)pRVar1 + lVar10 + -8);
      if (iVar5 != -1) {
        local_44 = *(undefined4 *)((long)pRVar1 + lVar10 + -4);
        local_40 = *(undefined4 *)((long)pRVar1 + lVar10);
        local_48 = iVar5;
        uVar2 = ref_cell_with(ref_cell,&local_48,&local_4c);
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x49f,"ref_cavity_form_insert2_unconstrain",(ulong)uVar2,"find tri");
          uVar3 = uVar2;
        }
        if ((uVar2 != 5) && (uVar2 != 0)) {
          return uVar3;
        }
        if ((((long)local_4c != -1) &&
            (ref_cell->c2n[(long)ref_cell->size_per * (long)local_4c + 3] == faceid)) &&
           (uVar2 = ref_cavity_add_tri(ref_cavity,local_4c), uVar2 != 0)) {
          pcVar9 = "tri";
          uVar6 = 0x4a1;
          goto LAB_00161e4d;
        }
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < ref_cavity->maxface);
  }
  uVar3 = ref_list_erase(ref_cavity->tet_list);
  if (uVar3 == 0) {
    ref_cavity->nface = 0;
    iVar5 = ref_cavity->maxface;
    pRVar1 = ref_cavity->f2n;
    if (0 < iVar5) {
      pRVar7 = pRVar1 + 1;
      lVar10 = 0;
      do {
        pRVar7[-1] = -1;
        lVar10 = lVar10 + 1;
        *pRVar7 = (REF_INT)lVar10;
        iVar5 = ref_cavity->maxface;
        pRVar7 = pRVar7 + 3;
      } while (lVar10 < iVar5);
    }
    pRVar1[iVar5 * 3 + -2] = -1;
    ref_cavity->blankface = 0;
    if (ref_cavity->debug != 0) {
      printf(" unconst form tri state %d of %d old %d new\n",(ulong)ref_cavity->state,
             (ulong)(uint)ref_cavity->tri_list->n,(ulong)(uint)ref_cavity->nseg);
    }
    RVar4 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (RVar4 != 0) {
      pcVar9 = "ball seg manifold";
      uVar3 = 1;
      uVar6 = 0x4b6;
      uVar8 = 1;
      goto LAB_00161dbe;
    }
    if (ref_cavity->debug != 0) {
      printf(" unconst manifold tri state %d\n",(ulong)ref_cavity->state);
    }
    if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
      return 1;
    }
    uVar2 = ref_cavity_enlarge_conforming(ref_cavity);
    if (uVar2 != 0) {
      pcVar9 = "enlarge boundary";
      uVar6 = 0x4bb;
LAB_00161e4d:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar6,"ref_cavity_form_insert2_unconstrain",(ulong)uVar2,pcVar9);
      return uVar2;
    }
    if (ref_cavity->debug != 0) {
      printf(" unconst enlarge tri state %d\n",(ulong)ref_cavity->state);
    }
    if (ref_cavity->state != REF_CAVITY_VISIBLE) {
      return 1;
    }
    ref_cavity->state = REF_CAVITY_UNKNOWN;
    uVar3 = ref_cavity_form_insert2_tet(ref_cavity,faceid);
    if (uVar3 == 0) {
      return 0;
    }
    pcVar9 = "form tet ball";
    uVar6 = 0x4c3;
  }
  else {
    pcVar9 = "erase tet list";
    uVar6 = 0x4a6;
  }
  uVar8 = (ulong)uVar3;
LAB_00161dbe:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar6,
         "ref_cavity_form_insert2_unconstrain",uVar8,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_unconstrain(REF_CAVITY ref_cavity,
                                                       REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT face, nodes[4], cell;

  REIS(REF_CAVITY_BOUNDARY_CONSTRAINED, ref_cavity_state(ref_cavity),
       "attempt to unconstrain cavity that is not boundary constrained");
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell && ref_cell_c2n(ref_cell, 3, cell) == faceid) {
      RSS(ref_cavity_add_tri(ref_cavity, cell), "tri");
    }
  }

  /* undo faces */
  RSS(ref_list_erase(ref_cavity->tet_list), "erase tet list");
  ref_cavity_nface(ref_cavity) = 0;
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
    ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
  }
  ref_cavity_f2n(ref_cavity, 1, ref_cavity_maxface(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankface(ref_cavity) = 0;

  if (ref_cavity_debug(ref_cavity))
    printf(" unconst form tri state %d of %d old %d new\n",
           (int)ref_cavity_state(ref_cavity),
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  /* conform seg */
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf(" unconst manifold tri state %d\n",
           (int)ref_cavity_state(ref_cavity));
  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (ref_cavity_debug(ref_cavity))
    printf(" unconst enlarge tri state %d\n",
           (int)ref_cavity_state(ref_cavity));
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  /* redo faces */
  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}